

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O3

void __thiscall CLayer::Print(CLayer *this,FILE *pFile,int iMode)

{
  longlong lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  
  uVar10 = (undefined4)((ulong)in_RAX >> 0x20);
  if (pFile == (FILE *)0x0) {
    return;
  }
  if (iMode < 0x40) {
    if ((iMode != 0) && (iMode != 0x20)) {
LAB_001176a3:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                    ,0x167,"virtual void CLayer::Print(FILE *, int)");
    }
    iVar2 = GetOverFlow(this,0x40);
    uVar3 = GetOverFlow(this,0x400000);
    lVar1 = (this->super_CObject).m_Key;
    iVar4 = IsHorizontal(this);
    uVar6 = 0x48;
    if (iVar4 == 0) {
      uVar6 = 0x56;
    }
    fprintf((FILE *)pFile,"L%d(%c,%d):o(%3d,%3d)\n",(ulong)(uint)lVar1,uVar6,
            (ulong)(uint)this->m_iMaxCapacity,(ulong)uVar3,CONCAT44(uVar10,iVar2));
  }
  else if ((iMode == 0x40) || (iMode == 0x400)) {
    iVar2 = this->m_iMaxBX;
    if (0 < iVar2) {
      uVar5 = (ulong)(uint)this->m_iMaxBY;
      lVar9 = 0;
      do {
        if (0 < (int)uVar5) {
          lVar7 = 0;
          lVar8 = 0;
          do {
            (**(code **)(*(long *)((long)this->m_ppGrid[lVar9]->m_pAdjGrid + lVar7 + -0x78) + 0x10))
                      ((long)this->m_ppGrid[lVar9]->m_pAdjGrid + lVar7 + -0x78,pFile,iMode);
            lVar8 = lVar8 + 1;
            uVar5 = (ulong)this->m_iMaxBY;
            lVar7 = lVar7 + 0x98;
          } while (lVar8 < (long)uVar5);
          iVar2 = this->m_iMaxBX;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar2);
    }
  }
  else {
    if (iMode != 0x800) goto LAB_001176a3;
    iVar2 = this->m_iMaxBX;
    if (0 < iVar2) {
      uVar5 = (ulong)(uint)this->m_iMaxBY;
      lVar9 = 0;
      do {
        if (0 < (int)uVar5) {
          lVar7 = 0;
          lVar8 = 0;
          do {
            (**(code **)(*(long *)((long)this->m_ppGrid[lVar9]->m_pAdjGrid + lVar7 + -0x78) + 0x10))
                      ((long)this->m_ppGrid[lVar9]->m_pAdjGrid + lVar7 + -0x78,pFile,0x800);
            fputc(10,(FILE *)pFile);
            lVar8 = lVar8 + 1;
            uVar5 = (ulong)this->m_iMaxBY;
            lVar7 = lVar7 + 0x98;
          } while (lVar8 < (long)uVar5);
          iVar2 = this->m_iMaxBX;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar2);
    }
  }
  fflush((FILE *)pFile);
  return;
}

Assistant:

void CLayer::Print(FILE *pFile, int iMode)
{
	if(pFile==NULL)	return;

	int i,j;
	switch(iMode){
	case PRINT_MODE_CGDUMP:
		for (i=0;i<m_iMaxBX;++i)			
			for (j=0;j<m_iMaxBY;++j)
			{
				GetBoundary(i,j)->Print(pFile,iMode);
				fprintf(pFile,"\n");
			}				
			break;
	case PRINT_MODE_RESULT:
	case PRINT_MODE_OFDUMP:
		for (i=0;i<m_iMaxBX;++i)
			for (j=0;j<m_iMaxBY;++j)
				GetBoundary(i,j)->Print(pFile,iMode);
		break;
	case PRINT_MODE_TEXT:
	case PRINT_MODE_CONGET:
		{	
			int	iMaxOF		=	GetOverFlow(GET_MODE_MAX);
			int	iOverFlow	=	GetOverFlow(GET_MODE_SUM);

			fprintf(pFile,"L%d(%c,%d):o(%3d,%3d)\n",
				Z(),IsHorizontal()? 'H':'V',GetCapacity(GET_MODE_MAX),iOverFlow,iMaxOF);
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}